

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O3

void __thiscall
dap::BasicTypeInfo<dap::EvaluateResponse>::construct
          (BasicTypeInfo<dap::EvaluateResponse> *this,void *ptr)

{
  memset(ptr,0,0x110);
  *(long *)((long)ptr + 0x10) = (long)ptr + 0x20;
  *(undefined1 *)((long)ptr + 0x20) = 0;
  *(undefined8 *)((long)ptr + 0x38) = 0;
  *(undefined8 *)((long)ptr + 0x68) = 0;
  *(undefined8 *)((long)ptr + 0x70) = 0;
  *(undefined8 *)((long)ptr + 0x48) = 0;
  *(undefined8 *)((long)ptr + 0x50) = 0;
  *(undefined8 *)((long)ptr + 0x58) = 0;
  *(undefined8 *)((long)ptr + 0x60) = 0;
  *(undefined8 *)((long)ptr + 0x78) = 0;
  *(undefined8 *)((long)ptr + 0x80) = 0;
  *(undefined8 *)((long)ptr + 0x88) = 0;
  *(long *)((long)ptr + 0x68) = (long)ptr + 0x78;
  *(undefined8 *)((long)ptr + 0xa8) = 0;
  *(undefined8 *)((long)ptr + 0xb0) = 0;
  *(undefined8 *)((long)ptr + 0xb8) = 0;
  *(long *)((long)ptr + 0x98) = (long)ptr + 0xa8;
  *(undefined1 *)((long)ptr + 0xc0) = 0;
  *(long *)((long)ptr + 200) = (long)ptr + 0xd8;
  *(undefined1 *)((long)ptr + 0xd8) = 0;
  *(long *)((long)ptr + 0xe8) = (long)ptr + 0xf8;
  *(undefined1 *)((long)ptr + 0xf8) = 0;
  *(undefined8 *)((long)ptr + 0x110) = 0;
  return;
}

Assistant:

inline void construct(void* ptr) const override { new (ptr) T(); }